

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O0

JL_STATUS JlMemoryWriteCountValue(void *CountFieldPtr,size_t CountFieldSize,size_t CountValue)

{
  uint64_t *countElementInStructU64;
  uint32_t *countElementInStructU32;
  uint16_t *countElementInStructU16;
  uint8_t *countElementInStructU8;
  JL_STATUS jlStatus;
  size_t CountValue_local;
  size_t CountFieldSize_local;
  void *CountFieldPtr_local;
  
  if (CountFieldSize == 1) {
    if (CountValue < 0x100) {
      *(char *)CountFieldPtr = (char)CountValue;
      countElementInStructU8._4_4_ = JL_STATUS_SUCCESS;
    }
    else {
      countElementInStructU8._4_4_ = JL_STATUS_COUNT_FIELD_TOO_SMALL;
    }
  }
  else if (CountFieldSize == 2) {
    if (CountValue < 0x10000) {
      *(short *)CountFieldPtr = (short)CountValue;
      countElementInStructU8._4_4_ = JL_STATUS_SUCCESS;
    }
    else {
      countElementInStructU8._4_4_ = JL_STATUS_COUNT_FIELD_TOO_SMALL;
    }
  }
  else if (CountFieldSize == 4) {
    if (CountValue < 0x100000000) {
      *(int *)CountFieldPtr = (int)CountValue;
      countElementInStructU8._4_4_ = JL_STATUS_SUCCESS;
    }
    else {
      countElementInStructU8._4_4_ = JL_STATUS_COUNT_FIELD_TOO_SMALL;
    }
  }
  else if (CountFieldSize == 8) {
    *(size_t *)CountFieldPtr = CountValue;
    countElementInStructU8._4_4_ = JL_STATUS_SUCCESS;
  }
  else {
    countElementInStructU8._4_4_ = JL_STATUS_INTERNAL_ERROR;
  }
  return countElementInStructU8._4_4_;
}

Assistant:

JL_STATUS
    JlMemoryWriteCountValue
    (
        void*           CountFieldPtr,
        size_t          CountFieldSize,
        size_t          CountValue
    )
{
    JL_STATUS jlStatus;

    if( sizeof(uint8_t) == CountFieldSize )
    {
        uint8_t* countElementInStructU8 = (uint8_t*)CountFieldPtr;
        if( CountValue <= UINT8_MAX )
        {
            *countElementInStructU8 = (uint8_t)CountValue;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_COUNT_FIELD_TOO_SMALL;
        }
    }
    else if( sizeof(uint16_t) == CountFieldSize )
    {
        uint16_t* countElementInStructU16 = (uint16_t*)CountFieldPtr;
        if( CountValue <= UINT16_MAX )
        {
            *countElementInStructU16 = (uint16_t)CountValue;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_COUNT_FIELD_TOO_SMALL;
        }
    }
    else if( sizeof(uint32_t) == CountFieldSize )
    {
        uint32_t* countElementInStructU32 = (uint32_t*)CountFieldPtr;
        if( CountValue <= UINT32_MAX )
        {
            *countElementInStructU32 = (uint32_t)CountValue;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_COUNT_FIELD_TOO_SMALL;
        }
    }
    else if( sizeof(uint64_t) == CountFieldSize )
    {
        uint64_t* countElementInStructU64 = (uint64_t*)CountFieldPtr;
        *countElementInStructU64 = CountValue;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        // Invalid size.
        jlStatus = JL_STATUS_INTERNAL_ERROR;
    }

    return jlStatus;
}